

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

WeightParams * __thiscall
CoreML::Specification::LSTMWeightParams::mutable_blockinputrecursionmatrix(LSTMWeightParams *this)

{
  WeightParams *this_00;
  
  this_00 = this->blockinputrecursionmatrix_;
  if (this_00 == (WeightParams *)0x0) {
    this_00 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(this_00);
    this->blockinputrecursionmatrix_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::WeightParams* LSTMWeightParams::mutable_blockinputrecursionmatrix() {
  
  if (blockinputrecursionmatrix_ == NULL) {
    blockinputrecursionmatrix_ = new ::CoreML::Specification::WeightParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.LSTMWeightParams.blockInputRecursionMatrix)
  return blockinputrecursionmatrix_;
}